

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

bool __thiscall LineReader::ReadLine(LineReader *this,char **line_start,char **line_end)

{
  size_t sVar1;
  char *pcVar2;
  size_t __n;
  size_t read;
  size_t size_rest;
  size_t already_consumed;
  size_t size_read;
  char **line_end_local;
  char **line_start_local;
  LineReader *this_local;
  
  if ((this->line_start_ < this->buf_end_) && (this->line_end_ != (char *)0x0)) {
    this->line_start_ = this->line_end_ + 1;
  }
  else {
    sVar1 = fread(this->buf_,1,0x40000,(FILE *)this->file_);
    if (sVar1 == 0) {
      return false;
    }
    this->line_start_ = this->buf_;
    this->buf_end_ = this->buf_ + sVar1;
  }
  pcVar2 = (char *)memchr(this->line_start_,10,(long)this->buf_end_ - (long)this->line_start_);
  this->line_end_ = pcVar2;
  if (this->line_end_ == (char *)0x0) {
    __n = (long)this->buf_end_ - (long)this->line_start_;
    memmove(this->buf_,this->line_start_,__n);
    sVar1 = fread((void *)((long)this + __n + 8),1,0x40000 - __n,(FILE *)this->file_);
    this->buf_end_ = (char *)((long)this + sVar1 + __n + 8);
    this->line_start_ = this->buf_;
    pcVar2 = (char *)memchr(this->line_start_,10,(long)this->buf_end_ - (long)this->line_start_);
    this->line_end_ = pcVar2;
  }
  *line_start = this->line_start_;
  *line_end = this->line_end_;
  return true;
}

Assistant:

bool ReadLine(char** line_start, char** line_end) {
    if (line_start_ >= buf_end_ || !line_end_) {
      // Buffer empty, refill.
      size_t size_read = fread(buf_, 1, sizeof(buf_), file_);
      if (!size_read)
        return false;
      line_start_ = buf_;
      buf_end_ = buf_ + size_read;
    } else {
      // Advance to next line in buffer.
      line_start_ = line_end_ + 1;
    }

    line_end_ = (char*)memchr(line_start_, '\n', buf_end_ - line_start_);
    if (!line_end_) {
      // No newline. Move rest of data to start of buffer, fill rest.
      size_t already_consumed = line_start_ - buf_;
      size_t size_rest = (buf_end_ - buf_) - already_consumed;
      memmove(buf_, line_start_, size_rest);

      size_t read = fread(buf_ + size_rest, 1, sizeof(buf_) - size_rest, file_);
      buf_end_ = buf_ + size_rest + read;
      line_start_ = buf_;
      line_end_ = (char*)memchr(line_start_, '\n', buf_end_ - line_start_);
    }

    *line_start = line_start_;
    *line_end = line_end_;
    return true;
  }